

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O0

void __thiscall Fl_Text_Buffer::highlight(Fl_Text_Buffer *this,int start,int end)

{
  undefined1 local_24 [8];
  Fl_Text_Selection oldSelection;
  int end_local;
  int start_local;
  Fl_Text_Buffer *this_local;
  
  local_24._0_4_ = (this->mHighlight).mStart;
  local_24._4_4_ = (this->mHighlight).mEnd;
  oldSelection.mStart = *(int *)&(this->mHighlight).mSelected;
  oldSelection.mEnd = end;
  oldSelection._8_4_ = start;
  Fl_Text_Selection::set(&this->mHighlight,start,end);
  redisplay_selection(this,(Fl_Text_Selection *)local_24,&this->mHighlight);
  return;
}

Assistant:

void Fl_Text_Buffer::highlight(int start, int end)
{
  Fl_Text_Selection oldSelection = mHighlight;
  
  mHighlight.set(start, end);
  redisplay_selection(&oldSelection, &mHighlight);
}